

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::RaiseScope
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *variables)

{
  pointer pbVar1;
  bool bVar2;
  cmValue value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *varName;
  pointer name;
  
  pbVar1 = (variables->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (name = (variables->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; name != pbVar1; name = name + 1) {
    bVar2 = IsNormalDefinitionSet(this,name);
    if (bVar2) {
      value = GetDefinition(this,name);
      RaiseScope(this,name,value);
    }
    else {
      RaiseScope(this,name,(char *)0x0);
    }
  }
  return;
}

Assistant:

void cmMakefile::RaiseScope(const std::vector<std::string>& variables)
{
  for (auto const& varName : variables) {
    if (this->IsNormalDefinitionSet(varName)) {
      this->RaiseScope(varName, this->GetDefinition(varName));
    } else {
      // unset variable in parent scope
      this->RaiseScope(varName, nullptr);
    }
  }
}